

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall
re2::Regexp::ParseState::ParseCharClass
          (ParseState *this,StringPiece *s,Regexp **out_re,RegexpStatus *status)

{
  bool bVar1;
  Rune lo;
  Rune hi;
  undefined8 uVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  ParseFlags b;
  ParseFlags PVar6;
  ParseStatus PVar7;
  Regexp *this_00;
  CharClassBuilder *pCVar8;
  char *offset;
  byte local_da;
  byte local_d9;
  RuneRange local_a8;
  RuneRange rr;
  UGroup *g;
  int local_88;
  Rune local_84;
  int n;
  Rune r;
  StringPiece t;
  bool first;
  Regexp *re;
  undefined1 local_50 [7];
  bool negated;
  undefined1 local_40 [8];
  StringPiece whole_class;
  RegexpStatus *status_local;
  Regexp **out_re_local;
  StringPiece *s_local;
  ParseState *this_local;
  
  local_40 = (undefined1  [8])s->ptr_;
  whole_class.ptr_ = *(char **)&s->length_;
  whole_class._8_8_ = status;
  iVar5 = StringPiece::size(s);
  if ((iVar5 == 0) || (cVar3 = StringPiece::operator[](s,0), cVar3 != '[')) {
    RegexpStatus::set_code((RegexpStatus *)whole_class._8_8_,kRegexpInternalError);
    uVar2 = whole_class._8_8_;
    StringPiece::StringPiece((StringPiece *)local_50,(char *)0x0);
    RegexpStatus::set_error_arg((RegexpStatus *)uVar2,(StringPiece *)local_50);
    return false;
  }
  bVar1 = false;
  this_00 = (Regexp *)operator_new(0x28);
  PVar6 = this->flags_;
  b = operator~(FoldCase);
  PVar6 = operator&(PVar6,b);
  Regexp(this_00,kRegexpCharClass,PVar6);
  pCVar8 = (CharClassBuilder *)operator_new(0x40);
  CharClassBuilder::CharClassBuilder(pCVar8);
  (this_00->field_7).field_3.ccb_ = pCVar8;
  StringPiece::remove_prefix(s,1);
  iVar5 = StringPiece::size(s);
  if ((0 < iVar5) && (cVar3 = StringPiece::operator[](s,0), cVar3 == '^')) {
    StringPiece::remove_prefix(s,1);
    bVar1 = true;
    PVar6 = operator&(this->flags_,ClassNL);
    if ((PVar6 == NoParseFlags) || (PVar6 = operator&(this->flags_,NeverNL), PVar6 != NoParseFlags))
    {
      CharClassBuilder::AddRange((this_00->field_7).field_3.ccb_,10,10);
    }
  }
  t.length_._3_1_ = 1;
LAB_0013111b:
  iVar5 = StringPiece::size(s);
  local_d9 = 0;
  if (0 < iVar5) {
    cVar3 = StringPiece::operator[](s,0);
    local_da = 1;
    if (cVar3 == ']') {
      local_da = t.length_._3_1_;
    }
    local_d9 = local_da;
  }
  if ((local_d9 & 1) == 0) {
    iVar5 = StringPiece::size(s);
    if (iVar5 == 0) {
      RegexpStatus::set_code((RegexpStatus *)whole_class._8_8_,kRegexpMissingBracket);
      RegexpStatus::set_error_arg((RegexpStatus *)whole_class._8_8_,(StringPiece *)local_40);
      Decref(this_00);
      return false;
    }
    StringPiece::remove_prefix(s,1);
    if (bVar1) {
      CharClassBuilder::Negate((this_00->field_7).field_3.ccb_);
    }
    *out_re = this_00;
    return true;
  }
  cVar3 = StringPiece::operator[](s,0);
  if ((((cVar3 == '-') && ((t.length_._3_1_ & 1) == 0)) &&
      (PVar6 = operator&(this->flags_,PerlX), PVar6 == NoParseFlags)) &&
     ((iVar5 = StringPiece::size(s), iVar5 == 1 ||
      (cVar3 = StringPiece::operator[](s,1), cVar3 != ']')))) {
    _n = s->ptr_;
    t.ptr_ = *(char **)&s->length_;
    StringPiece::remove_prefix((StringPiece *)&n,1);
    local_88 = StringPieceToRune(&local_84,(StringPiece *)&n,(RegexpStatus *)whole_class._8_8_);
    if (local_88 < 0) {
      Decref(this_00);
      return false;
    }
    RegexpStatus::set_code((RegexpStatus *)whole_class._8_8_,kRegexpBadCharRange);
    uVar2 = whole_class._8_8_;
    offset = StringPiece::data(s);
    StringPiece::StringPiece((StringPiece *)&g,offset,local_88 + 1);
    RegexpStatus::set_error_arg((RegexpStatus *)uVar2,(StringPiece *)&g);
    Decref(this_00);
    return false;
  }
  t.length_._3_1_ = 0;
  iVar5 = StringPiece::size(s);
  if ((2 < iVar5) &&
     ((cVar3 = StringPiece::operator[](s,0), cVar3 == '[' &&
      (cVar3 = StringPiece::operator[](s,1), cVar3 == ':')))) goto code_r0x001312bf;
  goto LAB_00131320;
code_r0x001312bf:
  PVar7 = ParseCCName(s,this->flags_,(this_00->field_7).field_3.ccb_,
                      (RegexpStatus *)whole_class._8_8_);
  if (PVar7 != kParseOk) {
    if (PVar7 == kParseError) {
      Decref(this_00);
      return false;
    }
LAB_00131320:
    iVar5 = StringPiece::size(s);
    if (((2 < iVar5) && (cVar3 = StringPiece::operator[](s,0), cVar3 == '\\')) &&
       ((cVar3 = StringPiece::operator[](s,1), cVar3 == 'p' ||
        (cVar3 = StringPiece::operator[](s,1), cVar3 == 'P')))) {
      PVar7 = ParseUnicodeGroup(s,this->flags_,(this_00->field_7).field_3.ccb_,
                                (RegexpStatus *)whole_class._8_8_);
      if (PVar7 == kParseOk) goto LAB_0013111b;
      if (PVar7 == kParseError) {
        Decref(this_00);
        return false;
      }
    }
    rr = (RuneRange)MaybeParsePerlCCEscape(s,this->flags_);
    if (rr == (RuneRange)0x0) {
      RuneRange::RuneRange(&local_a8);
      bVar4 = ParseCCRange(this,s,&local_a8,(StringPiece *)local_40,
                           (RegexpStatus *)whole_class._8_8_);
      hi = local_a8.hi;
      lo = local_a8.lo;
      if (!bVar4) {
        Decref(this_00);
        return false;
      }
      pCVar8 = (this_00->field_7).field_3.ccb_;
      PVar6 = operator|(this->flags_,ClassNL);
      CharClassBuilder::AddRangeFlags(pCVar8,lo,hi,PVar6);
    }
    else {
      AddUGroup((this_00->field_7).field_3.ccb_,(UGroup *)rr,*(int *)((long)rr + 8),this->flags_);
    }
  }
  goto LAB_0013111b;
}

Assistant:

bool Regexp::ParseState::ParseCharClass(StringPiece* s,
                                        Regexp** out_re,
                                        RegexpStatus* status) {
  StringPiece whole_class = *s;
  if (s->size() == 0 || (*s)[0] != '[') {
    // Caller checked this.
    status->set_code(kRegexpInternalError);
    status->set_error_arg(NULL);
    return false;
  }
  bool negated = false;
  Regexp* re = new Regexp(kRegexpCharClass, flags_ & ~FoldCase);
  re->ccb_ = new CharClassBuilder;
  s->remove_prefix(1);  // '['
  if (s->size() > 0 && (*s)[0] == '^') {
    s->remove_prefix(1);  // '^'
    negated = true;
    if (!(flags_ & ClassNL) || (flags_ & NeverNL)) {
      // If NL can't match implicitly, then pretend
      // negated classes include a leading \n.
      re->ccb_->AddRange('\n', '\n');
    }
  }
  bool first = true;  // ] is okay as first char in class
  while (s->size() > 0 && ((*s)[0] != ']' || first)) {
    // - is only okay unescaped as first or last in class.
    // Except that Perl allows - anywhere.
    if ((*s)[0] == '-' && !first && !(flags_&PerlX) &&
        (s->size() == 1 || (*s)[1] != ']')) {
      StringPiece t = *s;
      t.remove_prefix(1);  // '-'
      Rune r;
      int n = StringPieceToRune(&r, &t, status);
      if (n < 0) {
        re->Decref();
        return false;
      }
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(StringPiece(s->data(), 1+n));
      re->Decref();
      return false;
    }
    first = false;

    // Look for [:alnum:] etc.
    if (s->size() > 2 && (*s)[0] == '[' && (*s)[1] == ':') {
      switch (ParseCCName(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Unicode character group like \p{Han}
    if (s->size() > 2 &&
        (*s)[0] == '\\' &&
        ((*s)[1] == 'p' || (*s)[1] == 'P')) {
      switch (ParseUnicodeGroup(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Perl character class symbols (extension).
    const UGroup *g = MaybeParsePerlCCEscape(s, flags_);
    if (g != NULL) {
      AddUGroup(re->ccb_, g, g->sign, flags_);
      continue;
    }

    // Otherwise assume single character or simple range.
    RuneRange rr;
    if (!ParseCCRange(s, &rr, whole_class, status)) {
      re->Decref();
      return false;
    }
    // AddRangeFlags is usually called in response to a class like
    // \p{Foo} or [[:foo:]]; for those, it filters \n out unless
    // Regexp::ClassNL is set.  In an explicit range or singleton
    // like we just parsed, we do not filter \n out, so set ClassNL
    // in the flags.
    re->ccb_->AddRangeFlags(rr.lo, rr.hi, flags_ | Regexp::ClassNL);
  }
  if (s->size() == 0) {
    status->set_code(kRegexpMissingBracket);
    status->set_error_arg(whole_class);
    re->Decref();
    return false;
  }
  s->remove_prefix(1);  // ']'

  if (negated)
    re->ccb_->Negate();

  *out_re = re;
  return true;
}